

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O3

void checkARCAccessorsSlow(Class cls)

{
  byte *pbVar1;
  SEL expected;
  bool bVar2;
  BOOL BVar3;
  bool bVar4;
  long lVar5;
  objc_method_list *poVar6;
  bool bVar7;
  
  if ((dtable_t)cls->dtable == uninstalled_dtable) {
    if (checkARCAccessorsSlow::retain == (SEL)0x0) {
      checkARCAccessorsSlow::retain = sel_registerName("retain");
      checkARCAccessorsSlow::release = sel_registerName("release");
      checkARCAccessorsSlow::autorelease = sel_registerName("autorelease");
      checkARCAccessorsSlow::isARC = sel_registerName("_ARCCompliantRetainRelease");
    }
    if (cls->super_class == (Class)0x0) {
      bVar7 = false;
    }
    else {
      checkARCAccessorsSlow(cls->super_class);
      bVar7 = (cls->super_class->info & 0x800) == 0;
    }
    poVar6 = cls->methods;
    if (poVar6 == (objc_method_list *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = false;
      do {
        if (0 < poVar6->count) {
          lVar5 = 0;
          bVar2 = bVar4;
          do {
            if (poVar6->size < 0x18) {
              __assert_fail("l->size >= sizeof(struct objc_method)",
                            "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/method.h"
                            ,0x53,
                            "struct objc_method *method_at_index(struct objc_method_list *, int)");
            }
            expected = *(SEL *)((long)&poVar6[1].count + poVar6->size * lVar5);
            BVar3 = selEqualUnTyped(expected,checkARCAccessorsSlow::retain);
            bVar4 = true;
            if ((((BVar3 == '\0') &&
                 (BVar3 = selEqualUnTyped(expected,checkARCAccessorsSlow::release), BVar3 == '\0'))
                && (BVar3 = selEqualUnTyped(expected,checkARCAccessorsSlow::autorelease),
                   BVar3 == '\0')) &&
               (BVar3 = selEqualUnTyped(expected,checkARCAccessorsSlow::isARC), bVar4 = bVar2,
               BVar3 != '\0')) goto LAB_00110160;
            lVar5 = lVar5 + 1;
            bVar2 = bVar4;
          } while (lVar5 < poVar6->count);
        }
        poVar6 = poVar6->next;
      } while (poVar6 != (objc_method_list *)0x0);
    }
    if (!bVar7 && !bVar4) {
LAB_00110160:
      pbVar1 = (byte *)((long)&cls->info + 1);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  return;
}

Assistant:

PRIVATE void checkARCAccessorsSlow(Class cls)
{
	if (cls->dtable != uninstalled_dtable)
	{
		return;
	}
	static SEL retain, release, autorelease, isARC;
	if (NULL == retain)
	{
		retain = sel_registerName("retain");
		release = sel_registerName("release");
		autorelease = sel_registerName("autorelease");
		isARC = sel_registerName("_ARCCompliantRetainRelease");
	}
	BOOL superIsFast = YES;
	if (cls->super_class != Nil)
	{
		checkARCAccessorsSlow(cls->super_class);
		superIsFast = objc_test_class_flag(cls->super_class, objc_class_flag_fast_arc);
	}
	BOOL selfImplementsRetainRelease = NO;
	for (struct objc_method_list *l=cls->methods ; l != NULL ; l= l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			SEL s = method_at_index(l, i)->selector;
			if (selEqualUnTyped(s, retain) ||
			    selEqualUnTyped(s, release) ||
			    selEqualUnTyped(s, autorelease))
			{
				selfImplementsRetainRelease = YES;
			}
			else if (selEqualUnTyped(s, isARC))
			{
				objc_set_class_flag(cls, objc_class_flag_fast_arc);
				return;
			}
		}
	}
	if (superIsFast && !selfImplementsRetainRelease)
	{
		objc_set_class_flag(cls, objc_class_flag_fast_arc);
	}
}